

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O3

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,vector<double,_std::allocator<double>_> *face_area,double sigma_f,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *mollified_normals)

{
  pointer pVVar1;
  double dVar2;
  value_handle _idx;
  mesh_ptr pPVar3;
  value_handle vVar4;
  pointer pFVar5;
  int iVar6;
  BaseHandle _idx_00;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar7;
  reference pvVar8;
  undefined4 extraout_var;
  size_type __new_size;
  const_reference pvVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  VertexIter VVar17;
  FaceIter FVar18;
  undefined1 local_2f8 [104];
  PropertyContainer local_290 [2];
  pointer local_250;
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  local_188;
  vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  local_170;
  uint local_158;
  BasePropHandleT<OpenMesh::VectorT<double,_3>_> local_154 [12];
  BasePropHandleT<OpenMesh::VectorT<double,_3>_> local_124;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  NonIterativeFeaturePreservingMeshFiltering *local_98;
  PropertyContainer *local_90;
  double local_88;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_80;
  undefined1 local_78 [8];
  VertexIter v_it;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> vertex_face_neighbor;
  
  local_98 = this;
  local_88 = sigma_f;
  local_80 = mollified_normals;
  OpenMesh::ArrayKernel::ArrayKernel((ArrayKernel *)local_2f8,(ArrayKernel *)mesh);
  local_2f8._0_8_ = &PTR__PolyConnectivity_001c14d0;
  std::
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  ::vector(&local_188,
           (vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
            *)&(mesh->super_Mesh).
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x170);
  std::
  vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  ::vector(&local_170,
           (vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
            *)&(mesh->super_Mesh).
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x188);
  local_158 = *(uint *)&(mesh->super_Mesh).
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .field_0x1a0;
  memcpy(local_154,
         &(mesh->super_Mesh).
          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
          .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
          .points_,0x84);
  local_2f8._0_8_ = &PTR__PolyConnectivity_001c13f0;
  _local_78 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  local_90 = (PropertyContainer *)
             &(mesh->super_Mesh).
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .field_0x8;
  local_a0 = local_88 * 0.5 * local_88 * 0.5;
  while( true ) {
    VVar17 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    _idx.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
    if (v_it.mesh_._0_4_ == (BaseHandle)VVar17.hnd_.super_BaseHandle.idx_ &&
        local_78 == (undefined1  [8])VVar17.mesh_) break;
    pPVar7 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                       (local_90,(BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                 (mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                                 super_BaseHandle.idx_);
    pvVar8 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                       (pPVar7,(int)_idx.super_BaseHandle.idx_);
    local_b8 = (pvVar8->super_VectorDataT<double,_3>).values_[0];
    local_b0 = (pvVar8->super_VectorDataT<double,_3>).values_[1];
    local_a8 = (pvVar8->super_VectorDataT<double,_3>).values_[2];
    stack0xffffffffffffff98 = (FaceIter)ZEXT816(0);
    getVertexFaceNeighbor
              (local_98,mesh,face_centroid,(VertexHandle)v_it.mesh_._0_4_,local_88,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&v_it.hnd_);
    if ((int)((ulong)((long)vertex_face_neighbor.
                            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start - v_it._8_8_) >> 2) < 1) {
      dVar13 = 0.0;
      dVar16 = 0.0;
      dVar15 = 0.0;
      dVar14 = 0.0;
    }
    else {
      dVar14 = 0.0;
      lVar10 = 0;
      dVar15 = 0.0;
      dVar16 = 0.0;
      dVar13 = 0.0;
      do {
        iVar6 = *(int *)(v_it._8_8_ + lVar10 * 4);
        pVVar1 = (face_centroid->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_c0 = pVVar1[iVar6].super_VectorDataT<double,_3>.values_[0];
        local_c8 = pVVar1[iVar6].super_VectorDataT<double,_3>.values_[1];
        local_d0 = pVVar1[iVar6].super_VectorDataT<double,_3>.values_[2];
        dVar12 = SQRT((local_d0 - local_a8) * (local_d0 - local_a8) +
                      (local_c0 - local_b8) * (local_c0 - local_b8) +
                      (local_c8 - local_b0) * (local_c8 - local_b0));
        dVar2 = exp((dVar12 * -0.5 * dVar12) / local_a0);
        dVar12 = (face_area->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[*(int *)(v_it._8_8_ + lVar10 * 4)];
        dVar16 = dVar16 + local_c0 * dVar12 * dVar2;
        dVar15 = dVar15 + local_c8 * dVar12 * dVar2;
        dVar14 = dVar14 + local_d0 * dVar12 * dVar2;
        dVar13 = dVar13 + dVar12 * dVar2;
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)((ulong)((long)vertex_face_neighbor.
                                            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                            ._M_impl.super__Vector_impl_data._M_start - v_it._8_8_)
                             >> 2));
    }
    uVar11 = (ulong)(uint)v_it.mesh_._0_4_;
    iVar6 = (**(_func_int **)(local_2f8._0_8_ + 0x10))(local_2f8);
    _idx_00.idx_ = -1;
    if (uVar11 < CONCAT44(extraout_var,iVar6)) {
      _idx_00.idx_ = (int)OpenMesh::ArrayKernel::handle((ArrayKernel *)local_2f8,local_250 + uVar11)
      ;
    }
    pPVar7 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                       ((PropertyContainer *)(local_2f8 + 8),local_154[0]);
    pvVar8 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar7,_idx_00.idx_);
    (pvVar8->super_VectorDataT<double,_3>).values_[0] = dVar16 / dVar13;
    (pvVar8->super_VectorDataT<double,_3>).values_[1] = dVar15 / dVar13;
    (pvVar8->super_VectorDataT<double,_3>).values_[2] = dVar14 / dVar13;
    if (v_it._8_8_ != 0) {
      operator_delete((void *)v_it._8_8_);
    }
    pPVar3 = v_it.mesh_;
    v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_78._8_4_.super_BaseHandle + 1);
    if ((ulong)pPVar3 >> 0x20 != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_78);
    }
  }
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (local_80,__new_size);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             local_2f8);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)local_2f8);
  join_0x00000010_0x00000000_ =
       OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)local_2f8);
  while( true ) {
    FVar18 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)local_2f8);
    vVar4.super_BaseHandle.idx_ =
         vertex_face_neighbor.
         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_;
    if (vertex_face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ == (BaseHandle)FVar18.hnd_.super_BaseHandle.idx_ &&
        (mesh_ptr)v_it._8_8_ == FVar18.mesh_) break;
    pPVar7 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>(local_290,local_124)
    ;
    pvVar9 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                       (pPVar7,(int)vVar4.super_BaseHandle.idx_);
    vVar4.super_BaseHandle.idx_ =
         vertex_face_neighbor.
         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_;
    pVVar1 = (local_80->
             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar1[(int)vertex_face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_start._0_4_].super_VectorDataT<double,_3>.values_
    [2] = (pvVar9->super_VectorDataT<double,_3>).values_[2];
    dVar13 = (pvVar9->super_VectorDataT<double,_3>).values_[1];
    pVVar1 = pVVar1 + (int)vertex_face_neighbor.
                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_;
    (pVVar1->super_VectorDataT<double,_3>).values_[0] =
         (pvVar9->super_VectorDataT<double,_3>).values_[0];
    (pVVar1->super_VectorDataT<double,_3>).values_[1] = dVar13;
    pFVar5 = vertex_face_neighbor.
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    vertex_face_neighbor.
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         (BaseHandle)(BaseHandle)((int)vVar4.super_BaseHandle.idx_ + 1);
    if ((ulong)pFVar5 >> 0x20 != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&v_it.hnd_);
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_2f8);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, std::vector<double> &face_area, double sigma_f,
                                                                  std::vector<TriMesh::Normal> &mollified_normals)
{
    TriMesh temp_mesh = mesh;

    double sigma_m = sigma_f / 2.0;

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point new_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;
        for(int i = 0; i < (int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];

            double dis = (centroid - pt).length();
            double weight = std::exp(- 0.5 * dis * dis / (sigma_m * sigma_m));

            double area = face_area[vertex_face_neighbor[i].idx()];
            new_point += centroid * area * weight;
            weight_sum += area * weight;
        }
        new_point /= weight_sum;

        int vertex_index = (*v_it).idx();
        TriMesh::VertexHandle vh = temp_mesh.vertex_handle(vertex_index);
        temp_mesh.set_point(vh, new_point);
    }

    mollified_normals.resize(mesh.n_faces());
    temp_mesh.request_face_normals();
    temp_mesh.update_face_normals();
    for(TriMesh::FaceIter f_it = temp_mesh.faces_begin(); f_it != temp_mesh.faces_end(); f_it++)
        mollified_normals[(*f_it).idx()] = temp_mesh.normal(*f_it);
}